

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  byte bVar1;
  size_t sVar2;
  byte *s_00;
  byte *pbVar3;
  bool bVar4;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    sVar2 = local_38.size;
    s_00 = (byte *)s;
    if (((anonymous_namespace)::chartype_table[(byte)*s] & 4) == 0) {
      if (((anonymous_namespace)::chartype_table[((byte *)s)[1]] & 4) != 0) {
        s_00 = (byte *)s + 1;
        goto LAB_001135b9;
      }
      if (((anonymous_namespace)::chartype_table[((byte *)s)[2]] & 4) != 0) {
        s_00 = (byte *)s + 2;
        goto LAB_001135b9;
      }
      bVar4 = ((anonymous_namespace)::chartype_table[((byte *)s)[3]] & 4) == 0;
      if (bVar4) {
        s_00 = (byte *)s + 4;
      }
      else {
        s_00 = (byte *)s + 3;
      }
    }
    else {
LAB_001135b9:
      bVar4 = false;
    }
    s = (char_t *)s_00;
    if (!bVar4) {
      bVar1 = *s_00;
      if (bVar1 == end_quote) {
        pbVar3 = s_00;
        if ((byte *)local_38.end != (byte *)0x0) {
          memmove(local_38.end + -local_38.size,local_38.end,(long)s_00 - (long)local_38.end);
          pbVar3 = s_00 + -sVar2;
        }
        *pbVar3 = 0;
        return (char_t *)(s_00 + 1);
      }
      if (((anonymous_namespace)::chartype_table[bVar1] & 8) == 0) {
        if ((ulong)bVar1 == 0x26) {
          s = strconv_escape((char_t *)s_00,&local_38);
        }
        else {
          if (bVar1 == 0) {
            return (char_t *)0x0;
          }
          s = (char_t *)(s_00 + 1);
        }
      }
      else {
        s = (char_t *)(s_00 + 1);
        *s_00 = 0x20;
        if ((bVar1 == 0xd) && (*s == 10)) {
          if ((byte *)local_38.end != (byte *)0x0) {
            memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
          }
          s = (char_t *)(s_00 + 2);
          local_38.size = local_38.size + 1;
          local_38.end = s;
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}